

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fIntegerStateQueryTests.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Functional::anon_unknown_2::SamplesTestCase::test(SamplesTestCase *this)

{
  StateVerifier *pSVar1;
  TestContext *pTVar2;
  int iVar3;
  uint uVar4;
  RenderTarget *pRVar5;
  MessageBuilder *pMVar6;
  MessageBuilder local_328;
  undefined8 local_1a8;
  GLint validSamples [2];
  MessageBuilder local_190;
  SamplesTestCase *local_10;
  SamplesTestCase *this_local;
  
  local_10 = this;
  pRVar5 = gles3::Context::getRenderTarget((this->super_ApiCase).super_TestCase.m_context);
  iVar3 = tcu::RenderTarget::getNumSamples(pRVar5);
  if (iVar3 < 2) {
    local_1a8 = 0x100000000;
    tcu::TestLog::operator<<
              (&local_328,(this->super_ApiCase).m_log,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar6 = tcu::MessageBuilder::operator<<
                       (&local_328,(char (*) [34])"Expecting GL_SAMPLES to be 0 or 1");
    tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_328);
    (*this->m_verifier->_vptr_StateVerifier[9])
              (this->m_verifier,
               (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,0x80a9,
               &local_1a8,2);
    ApiCase::expectError(&this->super_ApiCase,0);
  }
  else {
    tcu::TestLog::operator<<
              (&local_190,(this->super_ApiCase).m_log,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar6 = tcu::MessageBuilder::operator<<(&local_190,(char (*) [17])"Sample count is ");
    pRVar5 = gles3::Context::getRenderTarget((this->super_ApiCase).super_TestCase.m_context);
    validSamples[0] = tcu::RenderTarget::getNumSamples(pRVar5);
    pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,validSamples);
    tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_190);
    pSVar1 = this->m_verifier;
    pTVar2 = (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx;
    pRVar5 = gles3::Context::getRenderTarget((this->super_ApiCase).super_TestCase.m_context);
    uVar4 = tcu::RenderTarget::getNumSamples(pRVar5);
    (*pSVar1->_vptr_StateVerifier[2])(pSVar1,pTVar2,0x80a9,(ulong)uVar4);
    ApiCase::expectError(&this->super_ApiCase,0);
  }
  return;
}

Assistant:

void test (void)
	{
		// MSAA?
		if (m_context.getRenderTarget().getNumSamples() > 1)
		{
			m_log << tcu::TestLog::Message << "Sample count is " << (m_context.getRenderTarget().getNumSamples()) << tcu::TestLog::EndMessage;

			m_verifier->verifyInteger(m_testCtx, GL_SAMPLES, m_context.getRenderTarget().getNumSamples());
			expectError(GL_NO_ERROR);
		}
		else
		{
			const glw::GLint validSamples[] = {0, 1};

			m_log << tcu::TestLog::Message << "Expecting GL_SAMPLES to be 0 or 1" << tcu::TestLog::EndMessage;

			m_verifier->verifyIntegerAnyOf(m_testCtx, GL_SAMPLES, validSamples, DE_LENGTH_OF_ARRAY(validSamples));
			expectError(GL_NO_ERROR);
		}
	}